

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int lws_retry_sul_schedule
              (lws_context *context,int tid,lws_sorted_usec_list_t *sul,lws_retry_bo_t *retry,
              sul_cb_t cb,uint16_t *ctry)

{
  uint uVar1;
  undefined8 in_RAX;
  char conceal;
  
  conceal = (char)((ulong)in_RAX >> 0x38);
  uVar1 = lws_retry_get_delay_ms(context,retry,ctry,&conceal);
  if (conceal != '\0') {
    _lws_log(8,"%s: sul %p: scheduling retry in %dms\n","lws_retry_sul_schedule",sul,(ulong)uVar1);
    lws_sul_schedule(context,tid,sul,cb,(ulong)uVar1 * 1000);
  }
  return (uint)(conceal == '\0');
}

Assistant:

int
lws_retry_sul_schedule(struct lws_context *context, int tid,
		       lws_sorted_usec_list_t *sul,
		       const lws_retry_bo_t *retry, sul_cb_t cb, uint16_t *ctry)
{
	char conceal;
	uint64_t ms = lws_retry_get_delay_ms(context, retry, ctry, &conceal);

	if (!conceal)
		return 1;

	lwsl_info("%s: sul %p: scheduling retry in %dms\n", __func__, sul,
			(int)ms);

	lws_sul_schedule(context, tid, sul, cb, ms * 1000);

	return 0;
}